

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedCommand(SelectionEvaluator *this,Token *token)

{
  SelectionEvaluator *in_RDI;
  string *in_stack_ffffffffffffff88;
  any *__any;
  any local_50 [2];
  string local_30 [48];
  
  __any = local_50;
  std::any_cast<std::__cxx11::string>(__any);
  std::operator+((char *)__any,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  evalError(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void unrecognizedCommand(const Token& token) {
      evalError("unrecognized command:" +
                std::any_cast<std::string>(token.value));
    }